

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profile.hpp
# Opt level: O1

bool __thiscall
ruckig::Profile::
check_for_second_order<(ruckig::Profile::ControlSigns)1,(ruckig::Profile::ReachedLimits)7>
          (Profile *this,double aUp,double aDown,double vMax,double vMin)

{
  double dVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  dVar6 = (this->t)._M_elems[0];
  if (0.0 <= dVar6) {
    (this->t_sum)._M_elems[0] = dVar6;
    dVar6 = (this->t)._M_elems[1];
    bVar5 = true;
    if (0.0 <= dVar6) {
      uVar2 = 0;
      do {
        uVar4 = uVar2;
        (this->t_sum)._M_elems[uVar4 + 1] = dVar6 + (this->t_sum)._M_elems[uVar4];
        if (uVar4 == 5) break;
        dVar6 = (this->t)._M_elems[uVar4 + 2];
        uVar2 = uVar4 + 1;
      } while (0.0 <= dVar6);
      bVar5 = uVar4 < 5;
    }
    if ((!bVar5) && ((this->t_sum)._M_elems[6] <= 1000000000000.0)) {
      (this->j)._M_elems[4] = 0.0;
      (this->j)._M_elems[5] = 0.0;
      (this->j)._M_elems[2] = 0.0;
      (this->j)._M_elems[3] = 0.0;
      (this->j)._M_elems[0] = 0.0;
      (this->j)._M_elems[1] = 0.0;
      (this->j)._M_elems[6] = 0.0;
      dVar6 = (this->t)._M_elems[2];
      dVar7 = (this->t)._M_elems[4];
      dVar9 = (this->t)._M_elems[6];
      dVar1 = this->af;
      (this->a)._M_elems[0] = (double)(-(ulong)(0.0 < (this->t)._M_elems[0]) & (ulong)aUp);
      (this->a)._M_elems[1] = 0.0;
      (this->a)._M_elems[2] = (double)(-(ulong)(0.0 < dVar6) & (ulong)aDown);
      (this->a)._M_elems[3] = 0.0;
      (this->a)._M_elems[4] = (double)(-(ulong)(0.0 < dVar7) & (ulong)aUp);
      (this->a)._M_elems[5] = 0.0;
      (this->a)._M_elems[6] = (double)(-(ulong)(0.0 < dVar9) & (ulong)aDown);
      (this->a)._M_elems[7] = dVar1;
      this->direction = (uint)(vMax <= 0.0);
      dVar6 = vMin;
      if (0.0 < vMax) {
        dVar6 = vMax;
        vMax = vMin;
      }
      dVar7 = (this->p)._M_elems[0];
      lVar3 = -0x38;
      dVar9 = (this->v)._M_elems[0];
      do {
        dVar1 = *(double *)((long)(this->t_sum)._M_elems + lVar3);
        dVar10 = *(double *)((long)(this->a)._M_elems + lVar3 + 0x38) * dVar1;
        dVar11 = dVar10 + dVar9;
        *(double *)((long)(this->p)._M_elems + lVar3) = dVar11;
        dVar7 = dVar7 + (dVar10 * 0.5 + dVar9) * dVar1;
        *(double *)((long)(this->brake).t._M_elems + lVar3 + -8) = dVar7;
        lVar3 = lVar3 + 8;
        dVar9 = dVar11;
      } while (lVar3 != 0);
      this->control_signs = UDUD;
      this->limits = NONE;
      if ((ABS((this->p)._M_elems[7] - this->pf) < 1e-08) &&
         (ABS((this->v)._M_elems[7] - this->vf) < 1e-08)) {
        dVar6 = dVar6 + 1e-12;
        dVar7 = (this->v)._M_elems[2];
        if ((dVar7 <= dVar6) &&
           (((dVar9 = (this->v)._M_elems[3], dVar9 <= dVar6 &&
             (dVar1 = (this->v)._M_elems[4], dVar1 <= dVar6)) &&
            (dVar10 = (this->v)._M_elems[5], dVar10 <= dVar6)))) {
          dVar8 = vMax + -1e-12;
          dVar11 = (this->v)._M_elems[6];
          return (bool)((dVar8 <= dVar11 && (dVar8 <= dVar10 && (dVar8 <= dVar1 && dVar11 <= dVar6))
                        ) & -(dVar8 <= dVar7) & -(dVar8 <= dVar9));
        }
      }
    }
  }
  return false;
}

Assistant:

bool check_for_second_order(double aUp, double aDown, double vMax, double vMin) {
        if (t[0] < 0) {
            return false;
        }

        t_sum[0] = t[0];
        for (size_t i = 0; i < 6; ++i) {
            if (t[i+1] < 0) {
                return false;
            }

            t_sum[i+1] = t_sum[i] + t[i+1];
        }

        if (t_sum.back() > t_max) { // For numerical reasons, is that needed?
            return false;
        }

        j = {0, 0, 0, 0, 0, 0, 0};
        if constexpr (control_signs == ControlSigns::UDDU) {
            a = {(t[0] > 0 ? aUp : 0), 0, (t[2] > 0 ? aDown : 0), 0, (t[4] > 0 ? aDown : 0), 0, (t[6] > 0 ? aUp : 0), af};
        } else {
            a = {(t[0] > 0 ? aUp : 0), 0, (t[2] > 0 ? aDown : 0), 0, (t[4] > 0 ? aUp : 0), 0, (t[6] > 0 ? aDown : 0), af};
        }

        direction = (vMax > 0) ? Profile::Direction::UP : Profile::Direction::DOWN;
        const double vUppLim = (direction == Profile::Direction::UP ? vMax : vMin) + v_eps;
        const double vLowLim = (direction == Profile::Direction::UP ? vMin : vMax) - v_eps;

        for (size_t i = 0; i < 7; ++i) {
            v[i+1] = v[i] + t[i] * a[i];
            p[i+1] = p[i] + t[i] * (v[i] + t[i] * a[i] / 2);
        }

        this->control_signs = control_signs;
        this->limits = limits;

        // Velocity limit can be broken in the beginning if both initial velocity and acceleration are too high
        // std::cout << std::setprecision(16) << "target: " << std::abs(p.back() - pf) << " " << std::abs(v.back() - vf) << " " << std::abs(a.back() - af) << " T: " << t_sum.back() << " " << to_string() << std::endl;
        return std::abs(p.back() - pf) < p_precision && std::abs(v.back() - vf) < v_precision
            && v[2] <= vUppLim && v[3] <= vUppLim && v[4] <= vUppLim && v[5] <= vUppLim && v[6] <= vUppLim
            && v[2] >= vLowLim && v[3] >= vLowLim && v[4] >= vLowLim && v[5] >= vLowLim && v[6] >= vLowLim;
    }